

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

unique_ptr<LoopStatement,_std::default_delete<LoopStatement>_> __thiscall Parser::loop(Parser *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  TokenStream *pTVar4;
  logic_error *this_00;
  undefined8 *in_RSI;
  undefined1 local_68 [24];
  _Head_base<0UL,_Statement_*,_false> local_50;
  vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TokenStream::next((Token *)local_68,(TokenStream *)*in_RSI);
  do {
    TokenStream::lookahead((Token *)local_68,(TokenStream *)*in_RSI);
    if (local_68._16_4_ == LeftBracket) {
      loop((Parser *)&local_50);
      local_68._0_8_ = local_50._M_head_impl;
      std::
      vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
      ::emplace_back<std::unique_ptr<Statement,std::default_delete<Statement>>>
                ((vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
                  *)&local_48,(unique_ptr<Statement,_std::default_delete<Statement>_> *)local_68);
    }
    else {
      if (local_68._16_4_ == RightBracket) {
        TokenStream::next((Token *)local_68,(TokenStream *)*in_RSI);
        pTVar4 = (TokenStream *)operator_new(0x20);
        puVar3 = local_48.
                 super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        puVar2 = local_48.
                 super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar1 = local_48.
                 super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_48.
        super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(undefined ***)&(pTVar4->supplier).super__Function_base._M_functor = &PTR_kind_0010db50;
        *(pointer *)((long)&(pTVar4->supplier).super__Function_base._M_functor + 8) = puVar1;
        (pTVar4->supplier).super__Function_base._M_manager = (_Manager_type)puVar2;
        (pTVar4->supplier)._M_invoker = (_Invoker_type)puVar3;
        local_68._16_8_ = (pointer)0x0;
        local_68._0_8_ = (__uniq_ptr_impl<Statement,_std::default_delete<Statement>_>)0x0;
        local_68._8_8_ = (pointer)0x0;
        this->tokenStream = pTVar4;
        std::
        vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
        ::~vector((vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
                   *)local_68);
        std::
        vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
        ::~vector(&local_48);
        return (__uniq_ptr_data<LoopStatement,_std::default_delete<LoopStatement>,_true,_true>)
               (__uniq_ptr_data<LoopStatement,_std::default_delete<LoopStatement>,_true,_true>)this;
      }
      if (local_68._16_4_ == EndOfFile) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"Unexpected end of input");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      single((Parser *)local_68);
      std::
      vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
      ::emplace_back<std::unique_ptr<Statement,std::default_delete<Statement>>>
                ((vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
                  *)&local_48,(unique_ptr<Statement,_std::default_delete<Statement>_> *)local_68);
    }
    if ((TokenStream *)local_68._0_8_ != (TokenStream *)0x0) {
      operator_delete((void *)local_68._0_8_,8);
    }
  } while( true );
}

Assistant:

auto Parser::loop() -> std::unique_ptr<LoopStatement> {
    auto statements = std::vector<std::unique_ptr<Statement>>();
    tokenStream.next(); // Consume left bracket token.

    TokenKind lookahead;
    while ((lookahead = tokenStream.lookahead().type) != TokenKind::RightBracket) {
        if (lookahead == TokenKind::EndOfFile)
            throw std::logic_error("Unexpected end of input");

        if (lookahead == TokenKind::LeftBracket)
            statements.push_back(loop());
        else statements.push_back(single());
    }

    tokenStream.next(); // Consume right bracket token.
    return std::make_unique<LoopStatement>(std::move(statements));
}